

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O3

int forwsearch(int f,int n)

{
  int iVar1;
  
  iVar1 = readpattern("Search");
  if (iVar1 == 1) {
    iVar1 = forwsrch();
    if (iVar1 == 0) {
      dobeep();
      iVar1 = 0;
      ewprintf("Search failed: \"%s\"",pat);
    }
    else {
      srch_lastdir = -1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
forwsearch(int f, int n)
{
	int	s;

	if ((s = readpattern("Search")) != TRUE)
		return (s);
	if (forwsrch() == FALSE) {
		dobeep();
		ewprintf("Search failed: \"%s\"", pat);
		return (FALSE);
	}
	srch_lastdir = SRCH_FORW;
	return (TRUE);
}